

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_psetshortstr(Table *t,TString *key,TValue *val)

{
  byte bVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *io1;
  TValue *io;
  TValue *io2;
  TString *x_;
  int iVar4;
  TValue tk;
  
  pTVar3 = luaH_Hgetshortstr(t,key);
  bVar1 = pTVar3->tt_;
  if ((bVar1 & 0xf) == 0) {
    iVar4 = 1;
    if ((t->metatable == (Table *)0x0) || ((t->metatable->flags & 2) != 0)) {
      if ((val->tt_ & 0xf) == 0) goto LAB_00119114;
      if (bVar1 == 0x20) {
        if (((t->marked & 0x20) != 0) && ((key->marked & 0x18) != 0)) {
          return 1;
        }
        tk.tt_ = key->tt | 0x40;
        tk.value_ = (Value)key;
        iVar2 = insertkey(t,&tk,val);
        if (iVar2 != 0) {
          t->flags = t->flags & 0xc0;
          goto LAB_00119114;
        }
        bVar1 = pTVar3->tt_;
      }
    }
    if (bVar1 != 0x20) {
      iVar4 = (int)(((long)pTVar3 - (long)t->node) / 0x18) + 3;
    }
  }
  else {
    pTVar3->value_ = val->value_;
    pTVar3->tt_ = val->tt_;
LAB_00119114:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int luaH_psetshortstr (Table *t, TString *key, TValue *val) {
  const TValue *slot = luaH_Hgetshortstr(t, key);
  if (!ttisnil(slot)) {  /* key already has a value? (all too common) */
    setobj(((lua_State*)NULL), cast(TValue*, slot), val);  /* update it */
    return HOK;  /* done */
  }
  else if (checknoTM(t->metatable, TM_NEWINDEX)) {  /* no metamethod? */
    if (ttisnil(val))  /* new value is nil? */
      return HOK;  /* done (value is already nil/absent) */
    if (isabstkey(slot) &&  /* key is absent? */
       !(isblack(t) && iswhite(key))) {  /* and don't need barrier? */
      TValue tk;  /* key as a TValue */
      setsvalue(cast(lua_State *, NULL), &tk, key);
      if (insertkey(t, &tk, val)) {  /* insert key, if there is space */
        invalidateTMcache(t);
        return HOK;
      }
    }
  }
  /* Else, either table has new-index metamethod, or it needs barrier,
     or it needs to rehash for the new key. In any of these cases, the
     operation cannot be completed here. Return a code for the caller. */
  return retpsetcode(t, slot);
}